

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O0

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  void *pvVar5;
  AlignedMemoryPool<6U> *pAVar6;
  byte in_CL;
  result_type_conflict in_EDX;
  long *in_RSI;
  int *in_RDI;
  random_device rd;
  istringstream c_1;
  string a2_1;
  istringstream c;
  string a2;
  string arg;
  int argi;
  unsigned_long num_mb;
  undefined4 in_stack_ffffffffffffe838;
  int in_stack_ffffffffffffe83c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe840;
  undefined1 shared;
  char ***in_stack_ffffffffffffe848;
  void *cap;
  int *in_stack_ffffffffffffe850;
  random_device *in_stack_ffffffffffffe880;
  size_t in_stack_ffffffffffffe888;
  allocator *paVar7;
  undefined6 in_stack_ffffffffffffe890;
  undefined1 in_stack_ffffffffffffe896;
  undefined1 in_stack_ffffffffffffe897;
  int local_3b4;
  istringstream local_3b0 [391];
  allocator local_229;
  string local_228 [32];
  istringstream local_208 [391];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  ulong local_20;
  byte local_15;
  result_type_conflict local_14;
  long *local_10;
  int *local_8;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<((ostream *)&std::cerr,"[cnn] using CPU\n");
  kSCALAR_MINUSONE =
       (undefined4 *)
       cnn_mm_malloc(CONCAT17(in_stack_ffffffffffffe897,
                              CONCAT16(in_stack_ffffffffffffe896,in_stack_ffffffffffffe890)),
                     in_stack_ffffffffffffe888);
  *kSCALAR_MINUSONE = 0xbf800000;
  kSCALAR_ONE = (undefined4 *)
                cnn_mm_malloc(CONCAT17(in_stack_ffffffffffffe897,
                                       CONCAT16(in_stack_ffffffffffffe896,in_stack_ffffffffffffe890)
                                      ),in_stack_ffffffffffffe888);
  *kSCALAR_ONE = 0x3f800000;
  kSCALAR_ZERO = (undefined4 *)
                 cnn_mm_malloc(CONCAT17(in_stack_ffffffffffffe897,
                                        CONCAT16(in_stack_ffffffffffffe896,in_stack_ffffffffffffe890
                                                )),in_stack_ffffffffffffe888);
  *kSCALAR_ZERO = 0;
  local_20 = 0x200;
  local_24 = 1;
  do {
    if (*local_8 <= local_24) break;
    pcVar1 = *(char **)(*local_10 + (long)local_24 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffe840,
                            (char *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe840,
                                (char *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838
                                                )), bVar2)) {
      if (*local_8 < local_24 + 1) {
        std::operator<<((ostream *)&std::cerr,
                        "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                       );
        abort();
      }
      pcVar1 = *(char **)(*local_10 + 8 + (long)local_24 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar1,&local_81);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::__cxx11::istringstream::istringstream(local_208,local_80,8);
      std::istream::operator>>(local_208,&local_20);
      RemoveArgs(in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                 (int *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      std::__cxx11::istringstream::~istringstream(local_208);
      std::__cxx11::string::~string(local_80);
LAB_003c3a08:
      local_3b4 = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe840,
                              (char *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838))
      ;
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe840,
                                  (char *)CONCAT44(in_stack_ffffffffffffe83c,
                                                   in_stack_ffffffffffffe838)), bVar2)) {
        if (*local_8 < local_24 + 1) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-seed expects an argument (the random number seed)\n");
          abort();
        }
        in_stack_ffffffffffffe880 = *(random_device **)(*local_10 + 8 + (long)local_24 * 8);
        paVar7 = &local_229;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,(char *)in_stack_ffffffffffffe880,paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        std::__cxx11::istringstream::istringstream(local_3b0,local_228,8);
        std::istream::operator>>(local_3b0,&local_14);
        RemoveArgs(in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                   (int *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        std::__cxx11::istringstream::~istringstream(local_3b0);
        std::__cxx11::string::~string(local_228);
        goto LAB_003c3a08;
      }
      lVar3 = std::__cxx11::string::find((char *)local_48,0x532172);
      if (lVar3 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] Bad command line argument: ");
        poVar4 = std::operator<<(poVar4,local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        abort();
      }
      local_3b4 = 3;
    }
    std::__cxx11::string::~string(local_48);
  } while (local_3b4 == 0);
  if (local_14 == 0) {
    std::random_device::random_device(in_stack_ffffffffffffe880);
    local_14 = std::random_device::operator()((random_device *)0x3c3a6c);
    std::random_device::~random_device((random_device *)0x3c3a8a);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] random seed: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,local_14);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  pvVar5 = operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffe840,CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838)
            );
  shared = (undefined1)((ulong)in_stack_ffffffffffffe840 >> 0x38);
  rndeng = pvVar5;
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] allocating memory: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
  std::operator<<(poVar4,"MB\n");
  pAVar6 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar6,(size_t)in_stack_ffffffffffffe848,(bool)shared);
  fxs = pAVar6;
  pAVar6 = fxs;
  pvVar5 = operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar6,(size_t)pvVar5,(bool)shared);
  dEdfs = pvVar5;
  cap = dEdfs;
  pvVar5 = operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar6,(size_t)cap,SUB81((ulong)pvVar5 >> 0x38,0));
  ps = pvVar5;
  std::operator<<((ostream *)&std::cerr,"[cnn] memory allocation done.\n");
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
#if HAVE_CUDA
  cerr << "[cnn] using GPU\n";
  Initialize_GPU(argc, argv);
#else
  cerr << "[cnn] using CPU\n";
  kSCALAR_MINUSONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ZERO = 0;
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  fxs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node values
  dEdfs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node gradients
  ps = new AlignedMemoryPool<ALIGN>(num_mb << 20, shared_parameters); // parameters
  cerr << "[cnn] memory allocation done.\n";
}